

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakCallback.h
# Opt level: O3

WeakCallback<sznet::net::TcpConnection> * __thiscall
sznet::makeWeakCallback<sznet::net::TcpConnection>
          (WeakCallback<sznet::net::TcpConnection> *__return_storage_ptr__,sznet *this,
          shared_ptr<sznet::net::TcpConnection> *object,offset_in_TcpConnection_to_subr function)

{
  _Atomic_word *p_Var1;
  int iVar2;
  weak_ptr<sznet::net::TcpConnection> local_48;
  _Any_data local_38;
  code *pcStack_28;
  code *pcStack_20;
  
  local_48.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)this;
  local_48.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_48.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count =
           (local_48.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count =
           (local_48.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  local_38._M_unused._M_object = (shared_ptr<sznet::net::TcpConnection> *)0x0;
  local_38._8_8_ = 0;
  pcStack_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  if (object != (shared_ptr<sznet::net::TcpConnection> *)0x0) {
    pcStack_20 = std::
                 _Function_handler<void_(sznet::net::TcpConnection_*),_void_(sznet::net::TcpConnection::*)()>
                 ::_M_invoke;
    pcStack_28 = std::
                 _Function_handler<void_(sznet::net::TcpConnection_*),_void_(sznet::net::TcpConnection::*)()>
                 ::_M_manager;
    local_38._M_unused._M_object = object;
    local_38._8_8_ = function;
  }
  WeakCallback<sznet::net::TcpConnection>::WeakCallback
            (__return_storage_ptr__,&local_48,
             (function<void_(sznet::net::TcpConnection_*)> *)&local_38);
  if (pcStack_28 != (code *)0x0) {
    (*pcStack_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_48.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_48.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_48.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_48.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_48.super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

WeakCallback<CLASS, ARGS...> makeWeakCallback(const std::shared_ptr<CLASS>& object, void (CLASS::*function)(ARGS...))
{
	return WeakCallback<CLASS, ARGS...>(object, function);
}